

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

tc_toktyp_t CTcTokenizer::tokenize_string(utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  byte bVar1;
  char *p_00;
  byte *pbVar2;
  bool bVar3;
  uint ch;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  tc_toktyp_t tVar7;
  wchar_t wVar8;
  ulong uVar9;
  long lVar10;
  tok_embed_level *ptVar11;
  byte *pbVar12;
  tc_toktyp_t tVar13;
  byte *pbVar14;
  int triple;
  wchar_t qu;
  bool bVar15;
  
  pbVar12 = (byte *)(ulong)(uint)expanding;
  p_00 = p->p_;
  wVar4 = utf8_ptr::s_getch(p_00);
  if (wVar4 == L'R') {
    bVar1 = *p->p_;
    p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
  }
  wVar5 = utf8_ptr::s_getch(p->p_);
  bVar1 = *p->p_;
  p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
  if (((wVar5 == L'\'') || (triple = 0, wVar5 == L'\"')) &&
     (iVar6 = count_quotes(p,wVar5), triple = 0, 1 < iVar6)) {
    pbVar2 = (byte *)p->p_;
    uVar9 = (ulong)(((*pbVar2 >> 5 & 1) != 0) + 1 & (uint)(*pbVar2 >> 7) * 3);
    p->p_ = (char *)(pbVar2 + uVar9 + 1);
    bVar1 = pbVar2[uVar9 + 1];
    p->p_ = (char *)(pbVar2 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar9 + 2);
    triple = 1;
  }
  qu = L'\"';
  if (wVar5 == L'\"') {
    bVar15 = ec != (tok_embed_ctx *)0x0;
    tVar7 = TOKT_DSTR;
    goto LAB_0025354a;
  }
  if (wVar5 != L'>') {
    bVar15 = false;
    if (wVar5 == L'\'') {
      bVar15 = ec != (tok_embed_ctx *)0x0;
      qu = L'\'';
      tVar7 = TOKT_SSTR;
    }
    else {
      tVar7 = TOKT_INVALID;
    }
    goto LAB_0025354a;
  }
  bVar15 = ec != (tok_embed_ctx *)0x0;
  if (ec == (tok_embed_ctx *)0x0) {
    tVar7 = TOKT_INVALID;
  }
  else {
    iVar6 = ec->level;
    qu = L'\0';
    tVar7 = TOKT_INVALID;
    if (iVar6 == 0) {
      triple = 0;
    }
    else {
      tVar7 = ec->s->endtok;
      qu = ec->s->qu;
      triple = ec->s->triple;
    }
    if (0 < iVar6) {
      ec->level = iVar6 + -1;
    }
    iVar6 = ec->level;
    if ((long)iVar6 == 0) {
      ptVar11 = (tok_embed_level *)0x0;
    }
    else {
      if (9 < iVar6) goto LAB_0025352a;
      ptVar11 = ec->stk + (long)iVar6 + -1;
    }
    ec->s = ptVar11;
  }
LAB_0025352a:
  bVar1 = *p->p_;
  p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
LAB_0025354a:
  tVar13 = TOKT_RESTR;
  if (wVar4 != L'R') {
    tVar13 = tVar7;
  }
  pbVar2 = (byte *)p->p_;
  do {
    wVar5 = utf8_ptr::s_getch(p->p_);
    if (wVar5 == L'\\') {
      bVar1 = *p->p_;
      pbVar14 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
      p->p_ = (char *)pbVar14;
      if ((triple == 0) || (wVar5 = utf8_ptr::s_getch((char *)pbVar14), wVar5 != qu)) {
LAB_002536ea:
        bVar1 = *p->p_;
        bVar3 = false;
        p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      }
      else {
        wVar5 = utf8_ptr::s_getch(p->p_);
        if (wVar5 == qu) {
          do {
            bVar1 = *p->p_;
            bVar3 = false;
            pbVar14 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3)
                                       + 1);
            p->p_ = (char *)pbVar14;
            wVar5 = utf8_ptr::s_getch((char *)pbVar14);
          } while (wVar5 == qu);
        }
        else {
LAB_0025379c:
          bVar3 = false;
        }
      }
    }
    else {
      if (((wVar4 == L'R') || (!(bool)(wVar5 == L'<' & bVar15))) ||
         (wVar8 = utf8_ptr::s_getch_at(p->p_,1), wVar8 != L'<')) {
        if (wVar5 == qu) {
          if (triple == 0) {
            pbVar12 = (byte *)p->p_;
            p->p_ = (char *)(pbVar12 +
                            (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1)
            ;
          }
          else {
            iVar6 = count_quotes(p,qu);
            if (iVar6 < 3) {
              if (iVar6 != 0) {
                lVar10 = (long)iVar6;
                pbVar14 = (byte *)p->p_;
                do {
                  pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 &
                                             (uint)(*pbVar14 >> 7) * 3) + 1;
                  p->p_ = (char *)pbVar14;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
            }
            else {
              if (iVar6 - 3U != 0) {
                uVar9 = (ulong)(iVar6 - 3U);
                pbVar12 = (byte *)p->p_;
                do {
                  pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 &
                                             (uint)(*pbVar12 >> 7) * 3) + 1;
                  p->p_ = (char *)pbVar12;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              pbVar12 = (byte *)p->p_;
              lVar10 = -3;
              pbVar14 = pbVar12;
              do {
                pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar14 >> 7) * 3) + 1;
                p->p_ = (char *)pbVar14;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0);
            }
            if (iVar6 < 3) goto LAB_0025379c;
          }
        }
        else {
          if (wVar5 != L'\0') goto LAB_002536ea;
          pbVar12 = (byte *)p->p_;
          if ((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) !=
              (undefined1  [3440])0x0) {
            log_error(0x272a);
          }
        }
        pbVar14 = (byte *)p->p_;
      }
      else {
        if (tVar13 == TOKT_SSTR) {
          tVar13 = TOKT_SSTR_START;
        }
        else if (tVar13 == TOKT_DSTR) {
          tVar13 = TOKT_DSTR_START;
        }
        else if (tVar13 == TOKT_DSTR_END) {
          tVar13 = TOKT_DSTR_MID;
        }
        else if (tVar13 == TOKT_SSTR_END) {
          tVar13 = TOKT_SSTR_MID;
        }
        tok_embed_ctx::start_expr(ec,qu,triple,(uint)(expanding == 0));
        pbVar12 = (byte *)p->p_;
        uVar9 = (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3);
        p->p_ = (char *)(pbVar12 + uVar9 + 1);
        bVar1 = pbVar12[uVar9 + 1];
        pbVar14 = pbVar12 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + uVar9 + 2;
        p->p_ = (char *)pbVar14;
      }
      tok->text_ = p_00;
      tok->text_len_ = (long)pbVar14 - (long)p_00;
      bVar3 = true;
    }
    if (bVar3) {
      if ((((undefined1  [3440])((undefined1  [3440])*G_tok & (undefined1  [3440])0x20) ==
            (undefined1  [3440])0x0) && (G_tok->string_fp_ != (CVmDataSource *)0x0)) &&
         (pbVar2 != pbVar12)) {
        CCharmapToLocal::write_file
                  (G_tok->string_fp_map_,G_tok->string_fp_,(char *)pbVar2,
                   (long)pbVar12 - (long)pbVar2);
        (*G_tok->string_fp_->_vptr_CVmDataSource[4])(G_tok->string_fp_,"\n",1);
      }
      tok->typ_ = tVar13;
      return tVar13;
    }
  } while( true );
}

Assistant:

tc_toktyp_t CTcTokenizer::tokenize_string(
    utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec, int expanding)
{
    /* remember where the text starts */
    const char *start = p->getptr();

    /* check for a regex string - R'...' or R"..." */
    int regex = (p->getch() == 'R');
    if (regex)
        p->inc();

    /* note the quote type, for matching later */
    wchar_t qu = p->getch();

    /* skip the quote in the input */
    p->inc();

    /* check for triple quotes */
    int triple = FALSE;
    if ((qu == '"' || qu == '\'') && count_quotes(p, qu) >= 2)
    {
        /* note the triple quotes */
        triple = TRUE;

        /* skip the open quotes */
        p->inc();
        p->inc();
    }

    /* determine the token type based on the quote type */
    tc_toktyp_t typ;
    int allow_embedding;
    switch(qu)
    {
    case '\'':
        /* single-quoted string */
        typ = TOKT_SSTR;
        allow_embedding = (ec != 0);
        break;

    case '"':
        /* regular double-quoted string */
        typ = TOKT_DSTR;
        allow_embedding = (ec != 0);
        break;

    case '>':
        /* get the ending type for the embedding */
        if (ec != 0)
        {
            /* return to the enclosing string context */
            typ = ec->endtok();
            qu = ec->qu();
            triple = ec->triple();

            /* allow more embeddings */
            allow_embedding = TRUE;

            /* exit the expression context */
            ec->end_expr();
        }
        else
        {
            /* we can only finish an embedding if we were already in one */
            typ = TOKT_INVALID;
            qu = '"';
            allow_embedding = FALSE;
        }

        /* skip the extra '>' character */
        p->inc();
        break;

    default:
        /* anything else is invalid */
        typ = TOKT_INVALID;
        qu = '"';
        allow_embedding = FALSE;
        break;
    }

    /* if it's a regex string, it has special handling */
    if (regex)
    {
        /* embeddings aren't allowed in regex strings */
        allow_embedding = FALSE;

        /* the token type is 'regex string' */
        typ = TOKT_RESTR;
    }

    /* this is where the string's contents start */
    const char *contents_start = p->getptr();

    /* we don't know where it ends yet */
    const char *contents_end;

    /* scan the string */
    for (;;)
    {
        /* get the current character */
        wchar_t cur = p->getch();

        /* see what we have */
        if (cur == '\\')
        {
            /* escape sequence - skip an extra character */
            p->inc();

            /* 
             *   if we're in a triple-quoted string, and this matches the
             *   quote type, a single '\' escapes all consecutive quotes 
             */
            if (triple && p->getch() == qu)
            {
                /* skip the whole run of quotes */
                for ( ; p->getch() == qu ; p->inc()) ;

                /* take it from the top, as we've already skipped them all */
                continue;
            }
        }
        else if (cur == '<' && allow_embedding && p->getch_at(1) == '<')
        {
            /* 
             *   it's the start of an embedded expression - return the
             *   appropriate embedded string part type 
             */
            typ = (typ == TOKT_DSTR ? TOKT_DSTR_START :
                   typ == TOKT_DSTR_END ? TOKT_DSTR_MID :
                   typ == TOKT_SSTR ? TOKT_SSTR_START :
                   typ == TOKT_SSTR_END ? TOKT_SSTR_MID :
                   typ);

            /* remember that we're in an embedding in the token stream */
            ec->start_expr(qu, triple, !expanding);

            /* this is where the contents end */
            contents_end = p->getptr();

            /* skip the two embedding characters */
            p->inc();
            p->inc();

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);

            /* done */
            break;
        }
        else if (cur == qu)
        {
            /* 
             *   if we're in a triple-quoted string, it ends at a triple
             *   quote, except that any additional consecutive quotes go
             *   inside the string rather than outside 
             */
            if (triple)
            {
                /* we need at least three quotes in a row to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* the contents include any quotes before the last 3 */
                    p->inc_by(qcnt - 3);
                    contents_end = p->getptr();

                    /* skip the three close quotes */
                    p->inc_by(3);
                }
                else
                {
                    /* it's not ending; skip the quotes and carry on */
                    p->inc_by(qcnt);
                    continue;
                }
            }
            else
            {
                /* note where the string ends */
                contents_end = p->getptr();

                /* skip the closing quote */
                p->inc();
            }

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);
            
            /* done */
            break;
        }
        else if (cur == '\0')
        {
            /* this is where the contents end */
            contents_end = p->getptr();

            /* 
             *   We have an unterminated string.  If we're evaluating a
             *   preprocessor constant expression, log an error; otherwise
             *   let it go for now, since we'll catch the error during the
             *   normal tokenizing pass for parsing. 
             */
            if (G_tok->in_pp_expr_)
                log_error(TCERR_PP_UNTERM_STRING);

            /* set the partial text */
            tok->set_text(start, p->getptr() - start);
            
            /* end of line - return with the string unfinished */
            break;
        }

        /* skip this character of input */
        p->inc();
    }

    /* 
     *   if we're not in preprocessor mode, and we're saving string text,
     *   write the string to the string text output file 
     */
    if (!G_tok->in_pp_expr_ && G_tok->string_fp_ != 0
        && contents_start != contents_end)
    {
        /* write the line, translating back to the source character set */
        G_tok->string_fp_map_
            ->write_file(G_tok->string_fp_, contents_start,
                         (size_t)(contents_end - contents_start));

        /* add a newline */
        G_tok->string_fp_->write("\n", 1);
    }

    /* set the type in the token */
    tok->settyp(typ);

    /* return the token type */
    return tok->gettyp();
}